

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O1

GLFWglproc getProcAddressEGL(char *procname)

{
  void *pvVar1;
  GLFWglproc p_Var2;
  
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if (*(long *)((long)pvVar1 + 0x298) != 0) {
    p_Var2 = (GLFWglproc)dlsym(*(long *)((long)pvVar1 + 0x298),procname);
    if (p_Var2 != (GLFWglproc)0x0) {
      return p_Var2;
    }
  }
  p_Var2 = (*_glfw.egl.GetProcAddress)(procname);
  return p_Var2;
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetTls(&_glfw.contextSlot);

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc) _glfw_dlsym(window->context.egl.client,
                                                   procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}